

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

GenericClassDefSymbol * __thiscall
slang::TypedBumpAllocator<slang::ast::GenericClassDefSymbol>::
emplace<std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation>
          (TypedBumpAllocator<slang::ast::GenericClassDefSymbol> *this,
          basic_string_view<char,_std::char_traits<char>_> *args,SourceLocation *args_1)

{
  string_view name;
  GenericClassDefSymbol *this_00;
  
  this_00 = (GenericClassDefSymbol *)BumpAllocator::allocate(&this->super_BumpAllocator,0x2f0,8);
  name._M_len = args->_M_len;
  name._M_str = args->_M_str;
  ast::GenericClassDefSymbol::GenericClassDefSymbol(this_00,name,*args_1);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }